

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O2

LinkedList<char> * __thiscall
data_structures::LinkedList<char>::deleteAfterNode(LinkedList<char> *this,ListNode<char> *_previous)

{
  ListNode<char> *pLVar1;
  ListNode<char> *temp_node;
  
  pLVar1 = _previous->_next;
  if (pLVar1 != (ListNode<char> *)0x0) {
    _previous->_next = pLVar1->_next;
    (*pLVar1->_vptr_ListNode[1])(pLVar1);
  }
  if (pLVar1 == this->_tail) {
    this->_tail = _previous;
  }
  this->_size = this->_size - 1;
  return this;
}

Assistant:

inline
    LinkedList<T>* LinkedList<T>::deleteAfterNode(ListNode<T>* _previous){
        ListNode<T>* _current = _previous->next();
        _previous->deleteAfter();
        delete _current;
        if (_current == _tail) {
            _tail = _previous;
        }
        _size--;
        return this;
    }